

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

void __thiscall FWriter::~FWriter(FWriter *this)

{
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *this_00;
  PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *this_01;
  FWriter *this_local;
  
  if ((this->mWriter1 != (Writer *)0x0) &&
     (this_00 = this->mWriter1,
     this_00 !=
     (Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
      *)0x0)) {
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::~Writer(this_00);
    operator_delete(this_00,0x40);
  }
  if ((this->mWriter2 != (PrettyWriter *)0x0) &&
     (this_01 = this->mWriter2,
     this_01 !=
     (PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
      *)0x0)) {
    rapidjson::
    PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::~PrettyWriter(this_01);
    operator_delete(this_01,0x48);
  }
  TMap<DObject_*,_int,_THashTraits<DObject_*>,_TValueTraits<int>_>::~TMap(&this->mObjectMap);
  TArray<DObject_*,_DObject_*>::~TArray(&this->mDObjects);
  rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  ~GenericStringBuffer(&this->mOutString);
  TArray<bool,_bool>::~TArray(&this->mInObject);
  return;
}

Assistant:

~FWriter()
	{
		if (mWriter1) delete mWriter1;
		if (mWriter2) delete mWriter2;
	}